

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O3

unique_ptr<wabt::StructType,_std::default_delete<wabt::StructType>_>
wabt::MakeUnique<wabt::StructType>(void)

{
  undefined8 *puVar1;
  __uniq_ptr_data<wabt::StructType,_std::default_delete<wabt::StructType>,_true,_true> in_RDI;
  string_view local_28;
  
  puVar1 = (undefined8 *)operator_new(0x68);
  local_28.data_ = (char *)0x0;
  local_28.size_ = 0;
  *puVar1 = &PTR__TypeEntry_001beac8;
  puVar1[1] = 0;
  puVar1[2] = 0;
  *(undefined8 *)((long)puVar1 + 0x14) = 0;
  *(undefined8 *)((long)puVar1 + 0x1c) = 0;
  string_view::to_string_abi_cxx11_((string *)(puVar1 + 5),&local_28);
  *(undefined4 *)(puVar1 + 9) = 1;
  *puVar1 = &PTR__StructType_001bf2d8;
  puVar1[10] = 0;
  puVar1[0xb] = 0;
  puVar1[0xc] = 0;
  *(undefined8 **)
   in_RDI.super___uniq_ptr_impl<wabt::StructType,_std::default_delete<wabt::StructType>_>._M_t.
   super__Tuple_impl<0UL,_wabt::StructType_*,_std::default_delete<wabt::StructType>_>.
   super__Head_base<0UL,_wabt::StructType_*,_false>._M_head_impl = puVar1;
  return (__uniq_ptr_data<wabt::StructType,_std::default_delete<wabt::StructType>,_true,_true>)
         (tuple<wabt::StructType_*,_std::default_delete<wabt::StructType>_>)
         in_RDI.super___uniq_ptr_impl<wabt::StructType,_std::default_delete<wabt::StructType>_>._M_t
         .super__Tuple_impl<0UL,_wabt::StructType_*,_std::default_delete<wabt::StructType>_>.
         super__Head_base<0UL,_wabt::StructType_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}